

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O1

int scan_modifiers(uint8_t *p,uint len)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  int iVar5;
  int bot;
  int iVar6;
  int local_34;
  
  iVar5 = 0;
  iVar6 = 0x4c;
  do {
    if (iVar6 <= iVar5) {
      return -1;
    }
    iVar4 = (iVar5 + iVar6) / 2;
    __s = modlist[iVar4].name;
    sVar3 = strlen(__s);
    __n = (size_t)len;
    if ((uint)sVar3 < len) {
      __n = sVar3 & 0xffffffff;
    }
    iVar2 = strncmp((char *)p,__s,__n);
    if ((iVar2 == 0) && (iVar2 = len - (uint)sVar3, iVar2 == 0)) {
      bVar1 = false;
      local_34 = iVar4;
    }
    else {
      if (0 < iVar2) {
        iVar5 = iVar4 + 1;
        iVar4 = iVar6;
      }
      bVar1 = true;
      iVar6 = iVar4;
    }
  } while (bVar1);
  return local_34;
}

Assistant:

static int
scan_modifiers(const uint8_t *p, unsigned int len)
{
int bot = 0;
int top = MODLISTCOUNT;

while (top > bot)
  {
  int mid = (bot + top)/2;
  unsigned int mlen = strlen(modlist[mid].name);
  int c = strncmp((char *)p, modlist[mid].name, (len < mlen)? len : mlen);
  if (c == 0)
    {
    if (len == mlen) return mid;
    c = len - mlen;
    }
  if (c > 0) bot = mid + 1; else top = mid;
  }

return -1;

}